

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Cba_Man_t * Cba_ManDeriveFromGia(Cba_Man_t *pOld,Gia_Man_t *pGia,int fUseXor)

{
  Vec_Int_t *p;
  Gia_Obj_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  int x;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Abc_Nam_t *pAVar12;
  Abc_Nam_t *pFuns;
  Cba_Man_t *p_00;
  Cba_Ntk_t *pNtk;
  Vec_Int_t *vLit2Fon;
  int *__s;
  char *pcVar13;
  int *piVar14;
  Vec_Int_t *pVVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int local_34;
  
  pcVar13 = pGia->pSpec;
  if (pOld == (Cba_Man_t *)0x0) {
    pAVar12 = (Abc_Nam_t *)0x0;
    pFuns = (Abc_Nam_t *)0x0;
  }
  else {
    pAVar12 = Abc_NamRef(pOld->pStrs);
    pFuns = Abc_NamRef(pOld->pFuns);
  }
  __s = (int *)0x0;
  p_00 = Cba_ManAlloc(pcVar13,1,pAVar12,pFuns,(Abc_Nam_t *)0x0,(Hash_IntMan_t *)0x0);
  iVar6 = Abc_NamStrFindOrAdd(p_00->pStrs,pGia->pName,(int *)0x0);
  pNtk = Cba_NtkAlloc(p_00,iVar6,pGia->vCis->nSize,pGia->vCos->nSize,1000,2000,2000);
  iVar6 = pGia->nObjs;
  iVar11 = iVar6 * 2;
  vLit2Fon = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar8 = iVar11;
  }
  vLit2Fon->nSize = 0;
  vLit2Fon->nCap = iVar8;
  if (iVar8 != 0) {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  vLit2Fon->pArray = __s;
  vLit2Fon->nSize = iVar11;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar6 << 3);
  }
  pAVar12 = p_00->pMods;
  pcVar13 = Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
  iVar6 = Abc_NamStrFindOrAdd(pAVar12,pcVar13,&local_34);
  if (local_34 == 0) {
    if (iVar6 != pNtk->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x1f7,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  p = &pNtk->vObjName;
  uVar10 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjName).nCap < (int)uVar10) {
    piVar14 = (pNtk->vObjName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar10 << 2);
    }
    (pNtk->vObjName).pArray = piVar14;
    if (piVar14 == (int *)0x0) goto LAB_003d9828;
    p->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vObjName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vObjName).nSize = uVar10;
  pVVar15 = pGia->vCis;
  if (0 < pVVar15->nSize) {
    uVar17 = 0;
    do {
      uVar10 = pVVar15->pArray[uVar17];
      if (((int)uVar10 < 0) || (pGia->nObjs <= (int)uVar10)) goto LAB_003d96ca;
      if ((ulong)uVar10 == 0) break;
      pVVar2 = pGia->vNamesIn;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        iVar6 = Cba_NtkNewStrId(pNtk,"i%d",uVar17 & 0xffffffff);
      }
      else {
        if ((long)pVVar2->nSize <= (long)uVar17) goto LAB_003d97cb;
        iVar6 = Abc_NamStrFindOrAdd(p_00->pStrs,(char *)pVVar2->pArray[uVar17],(int *)0x0);
      }
      uVar7 = Cba_ObjAlloc(pNtk,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(pNtk,uVar7,iVar6);
      if ((int)uVar7 < 1) goto LAB_003d96e9;
      if ((pNtk->vObjFon0).nSize <= (int)uVar7) goto LAB_003d96ab;
      if (iVar11 <= (int)(uVar10 * 2)) goto LAB_003d97ac;
      __s[(ulong)uVar10 * 2] = (pNtk->vObjFon0).pArray[uVar7];
      uVar17 = uVar17 + 1;
      pVVar15 = pGia->vCis;
    } while ((long)uVar17 < (long)pVVar15->nSize);
  }
  if (0 < pGia->nObjs) {
    iVar6 = 0;
    lVar16 = 0;
    lVar18 = 0;
    do {
      pGVar3 = pGia->pObjs;
      uVar17 = *(ulong *)(&pGVar3->field_0x0 + lVar16);
      uVar10 = (uint)uVar17;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        if (((int)((int)lVar18 - (uVar10 & 0x1fffffff)) < 0) ||
           (uVar7 = (uint)(uVar17 >> 0x20) & 0x1fffffff, (int)((int)lVar18 - uVar7) < 0))
        goto LAB_003d9708;
        pGVar1 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar16);
        x = Cba_NtkInsertGiaLit(pNtk,iVar6 + (uint)((uVar10 >> 0x1d & 1) != 0) +
                                     (uVar10 & 0x1fffffff) * -2,vLit2Fon,fUseXor);
        iVar8 = Cba_NtkInsertGiaLit(pNtk,iVar6 + (uint)((uVar17 >> 0x3d & 1) != 0) + uVar7 * -2,
                                    vLit2Fon,fUseXor);
        pGVar4 = pGia->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar5 = pGia->pMuxes;
        if ((puVar5 == (uint *)0x0) ||
           (puVar5[(int)((ulong)((long)pGVar3 + (lVar16 - (long)pGVar4)) >> 2) * -0x55555555] == 0))
        {
          uVar10 = (uint)*(undefined8 *)pGVar1;
          if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                          ,0x415,
                          "int Cba_NtkInsertGiaObj(Cba_Ntk_t *, Gia_Man_t *, int, Vec_Int_t *, int)"
                         );
          }
          uVar10 = Cba_ObjAlloc(pNtk,(uint)((uVar10 & 0x1fffffff) <
                                           ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) &
                                           0x1fffffff)) * 4 + CBA_BOX_AND,2,1);
          Cba_ObjSetFinFon(pNtk,uVar10,0,x);
          iVar9 = 1;
        }
        else {
          iVar9 = Cba_NtkInsertGiaLit(pNtk,-(uint)(puVar5[lVar18] == 0) | puVar5[lVar18],vLit2Fon,
                                      fUseXor);
          uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_MUX,3,1);
          Cba_ObjSetFinFon(pNtk,uVar10,0,iVar9);
          Cba_ObjSetFinFon(pNtk,uVar10,1,iVar8);
          iVar9 = 2;
          iVar8 = x;
        }
        Cba_ObjSetFinFon(pNtk,uVar10,iVar9,iVar8);
        if ((int)uVar10 < 1) goto LAB_003d96e9;
        if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_003d96ab;
        if (iVar11 <= iVar6) {
LAB_003d97ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar18 * 2] = (pNtk->vObjFon0).pArray[uVar10];
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0xc;
      iVar6 = iVar6 + 2;
    } while (lVar18 < pGia->nObjs);
  }
  pVVar15 = pGia->vCos;
  if (0 < pVVar15->nSize) {
    lVar16 = 0;
    do {
      iVar6 = pVVar15->pArray[lVar16];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) goto LAB_003d96ca;
      if (iVar6 == 0) break;
      iVar11 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
      if (iVar11 < 0) goto LAB_003d9708;
      Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar11 * 2,vLit2Fon,
                          fUseXor);
      lVar16 = lVar16 + 1;
      pVVar15 = pGia->vCos;
    } while (lVar16 < pVVar15->nSize);
  }
  pVVar15 = pGia->vCos;
  if (0 < pVVar15->nSize) {
    uVar17 = 0;
    do {
      iVar6 = pVVar15->pArray[uVar17];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) {
LAB_003d96ca:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar6 == 0) break;
      iVar11 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
      if (iVar11 < 0) {
LAB_003d9708:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar6 = Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar11 * 2,
                                  vLit2Fon,fUseXor);
      uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_BUF,1,1);
      Cba_ObjSetFinFon(pNtk,uVar10,0,iVar6);
      if ((int)uVar10 < 1) goto LAB_003d96e9;
      if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_003d96ab;
      iVar6 = (pNtk->vObjFon0).pArray[uVar10];
      pVVar2 = pGia->vNamesOut;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        iVar11 = Cba_NtkNewStrId(pNtk,"o%d",uVar17 & 0xffffffff);
      }
      else {
        if ((long)pVVar2->nSize <= (long)uVar17) {
LAB_003d97cb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar11 = Abc_NamStrFindOrAdd(p_00->pStrs,(char *)pVVar2->pArray[uVar17],(int *)0x0);
      }
      iVar8 = Cba_ObjAlloc(pNtk,CBA_OBJ_PO,1,0);
      Cba_ObjSetName(pNtk,iVar8,iVar11);
      Cba_ObjSetFinFon(pNtk,iVar8,0,iVar6);
      uVar17 = uVar17 + 1;
      pVVar15 = pGia->vCos;
    } while ((long)uVar17 < (long)pVVar15->nSize);
  }
  pVVar15 = &pNtk->vFonName;
  uVar10 = (pNtk->vFonObj).nCap;
  if ((pNtk->vFonName).nCap < (int)uVar10) {
    piVar14 = (pNtk->vFonName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar14;
    if (piVar14 == (int *)0x0) goto LAB_003d9828;
    pVVar15->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vFonName).nSize = uVar10;
  uVar10 = (pNtk->vFonObj).nCap;
  if ((pNtk->vFonName).nCap < (int)uVar10) {
    piVar14 = (pNtk->vFonName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar14;
    if (piVar14 == (int *)0x0) {
LAB_003d9828:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar15->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vFonName).nSize = uVar10;
  if (0 < (pNtk->vInputs).nSize) {
    lVar16 = 0;
    do {
      iVar6 = (pNtk->vInputs).pArray[lVar16];
      lVar18 = (long)iVar6;
      if (lVar18 < 1) {
LAB_003d96e9:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vObjFon0).nSize <= iVar6) goto LAB_003d96ab;
      if ((pNtk->vFonName).nSize < 1) goto LAB_003d9727;
      uVar10 = (pNtk->vObjFon0).pArray[lVar18];
      if ((int)uVar10 < 1) {
        pcVar13 = "Cba_FonIsReal(f)";
        goto LAB_003d9756;
      }
      Vec_IntFillExtra(pVVar15,uVar10 + 1,0);
      if ((pNtk->vFonName).nSize <= (int)uVar10) goto LAB_003d96ab;
      if ((pNtk->vFonName).pArray[uVar10] == 0) {
        if ((pNtk->vObjName).nSize < 1) goto LAB_003d97ea;
        Vec_IntFillExtra(p,iVar6 + 1,0);
        if ((pNtk->vObjName).nSize <= iVar6) goto LAB_003d96ab;
        Cba_FonSetName(pNtk,uVar10,(pNtk->vObjName).pArray[lVar18]);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar16 = 0;
    do {
      iVar6 = (pNtk->vOutputs).pArray[lVar16];
      lVar18 = (long)iVar6;
      if (lVar18 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pNtk->vObjFin0).nSize <= iVar6) {
LAB_003d96ab:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = (pNtk->vObjFin0).pArray[lVar18];
      if ((long)iVar11 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vFinFon).nSize <= iVar11) goto LAB_003d96ab;
      iVar11 = (pNtk->vFinFon).pArray[iVar11];
      if (0 < (long)iVar11) {
        if ((pNtk->vFonName).nSize < 1) {
LAB_003d9727:
          pcVar13 = "Cba_NtkHasFonNames(p)";
LAB_003d9756:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(pVVar15,iVar11 + 1,0);
        if ((pNtk->vFonName).nSize <= iVar11) goto LAB_003d96ab;
        if ((pNtk->vFonName).pArray[iVar11] == 0) {
          if ((pNtk->vObjName).nSize < 1) {
LAB_003d97ea:
            __assert_fail("Cba_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
          }
          Vec_IntFillExtra(p,iVar6 + 1,0);
          if ((pNtk->vObjName).nSize <= iVar6) goto LAB_003d96ab;
          Cba_FonSetName(pNtk,iVar11,(pNtk->vObjName).pArray[lVar18]);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pNtk->vOutputs).nSize);
  }
  Cba_NtkAddMissingFonNames(pNtk,"a");
  if (__s != (int *)0x0) {
    free(__s);
    vLit2Fon->pArray = (int *)0x0;
  }
  free(vLit2Fon);
  return p_00;
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Cba_Man_t * pOld, Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, pOld ? Abc_NamRef(pOld->pStrs) : NULL, pOld ? Abc_NamRef(pOld->pFuns) : NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}